

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

void btSoftBodyHelpers::DrawInfos
               (btSoftBody *psb,btIDebugDraw *idraw,bool masses,bool areas,bool param_5)

{
  int iVar1;
  int iVar2;
  byte in_CL;
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  byte in_R8B;
  char buff [1024];
  char text [2048];
  Node *n;
  int i;
  char local_c28 [1024];
  char local_828 [2056];
  Node *local_20;
  int local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  long *local_10;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    iVar1 = local_18;
    iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                      ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370));
    if (iVar2 <= iVar1) break;
    local_20 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(local_8 + 0x370),local_18);
    memset(local_828,0,0x800);
    if ((local_11 & 1) != 0) {
      sprintf(local_c28," M(%.2f)",(double)(1.0 / local_20->m_im));
      strcat(local_828,local_c28);
    }
    if ((local_12 & 1) != 0) {
      sprintf(local_c28," A(%.2f)",(double)local_20->m_area);
      strcat(local_828,local_c28);
    }
    if (local_828[0] != '\0') {
      (**(code **)(*local_10 + 0x60))(local_10,&local_20->m_x,local_828);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawInfos(		btSoftBody* psb,
											 btIDebugDraw* idraw,
											 bool masses,
											 bool areas,
											 bool /*stress*/)
{
	for(int i=0;i<psb->m_nodes.size();++i)
	{
		const btSoftBody::Node&	n=psb->m_nodes[i];
		char					text[2048]={0};
		char					buff[1024];
		if(masses)
		{
			sprintf(buff," M(%.2f)",1/n.m_im);
			strcat(text,buff);
		}
		if(areas)
		{
			sprintf(buff," A(%.2f)",n.m_area);
			strcat(text,buff);
		}
		if(text[0]) idraw->draw3dText(n.m_x,text);
	}
}